

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1121::run(TestCase1121 *this)

{
  Reader vatId;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  ArrayPtr<const_char> AVar2;
  ReaderFor<capnproto_test::capnp::test::TestSturdyRef> local_4c0;
  Reader local_490;
  ArrayPtr<const_char> local_470;
  bool local_459;
  undefined1 local_458 [7];
  bool _kj_shouldLog;
  Reader local_428;
  ArrayPtr<const_char> local_408;
  Maybe<capnp::MessageSize> local_3f8;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_3e0;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_3a8;
  undefined1 local_370 [8];
  Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  response;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  Client local_300;
  undefined1 local_2f0 [8];
  Client client;
  Client local_2c0;
  undefined1 local_2b0 [8];
  TestContext context;
  undefined1 local_188 [8];
  Builder hostId;
  MallocMessageBuilder hostIdBuilder;
  undefined1 local_60 [8];
  Client bootstrap;
  Own<capnp::_::(anonymous_namespace)::TestGateway> local_38;
  undefined1 local_28 [8];
  Client gateway;
  TestCase1121 *this_local;
  
  gateway._16_8_ = this;
  kj::heap<capnp::_::(anonymous_namespace)::TestGateway>();
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>
  ::Client::Client<capnp::_::(anonymous_namespace)::TestGateway,void>((Client *)local_28,&local_38);
  kj::Own<capnp::_::(anonymous_namespace)::TestGateway>::~Own(&local_38);
  kj::heap<capnp::_::(anonymous_namespace)::TestPersistentText,char_const(&)[4]>
            ((kj *)&hostIdBuilder.moreSegments.builder.disposer,(char (*) [4])0xa4c8db);
  Persistent<capnp::Text,capnp::AnyPointer>::Client::
  Client<capnp::_::(anonymous_namespace)::TestPersistentText,void>
            ((Client *)local_60,
             (Own<capnp::_::(anonymous_namespace)::TestPersistentText> *)
             &hostIdBuilder.moreSegments.builder.disposer);
  kj::Own<capnp::_::(anonymous_namespace)::TestPersistentText>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestPersistentText> *)
             &hostIdBuilder.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&hostId._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestSturdyRefHostId>
            ((Builder *)local_188,(MessageBuilder *)&hostId._builder.dataSize);
  Text::Reader::Reader((Reader *)&context.rpcServer.super_RpcSystemBase.impl.ptr,"server");
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::setHost
            ((Builder *)local_188,(Reader)stack0xfffffffffffffe68);
  Capability::Client::Client
            (&local_2c0,(Client *)(local_60 + (long)*(_func_int **)((long)local_60 + -0x18)));
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::Client::Client((Client *)&client.field_0x10,(Client *)local_28);
  TestContext::TestContext((TestContext *)local_2b0,&local_2c0,(Client *)&client.field_0x10);
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::Client::~Client((Client *)&client.field_0x10);
  Capability::Client::~Client(&local_2c0);
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::operator_cast_to_Reader
            ((Reader *)&response.hook.ptr,(Builder *)local_188);
  vatId._reader.capTable = (CapTableReader *)uStack_328;
  vatId._reader.segment = (SegmentReader *)response.hook.ptr;
  vatId._reader.data = (void *)local_320;
  vatId._reader.pointers = (WirePointer *)uStack_318;
  vatId._reader._32_8_ = local_310;
  vatId._reader._40_8_ = uStack_308;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::bootstrap
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)&local_300,vatId);
  Capability::Client::
  castAs<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>>
            ((Client *)local_2f0,&local_300);
  Capability::Client::~Client(&local_300);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_3f8,(void *)0x0);
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::saveRequest
            (&local_3e0,(Client *)local_2f0,&local_3f8);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::send(&local_3a8,(int)&local_3e0,__buf,in_RCX,in_R8D);
  kj::
  Promise<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
  ::wait((Promise<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
          *)local_370,&local_3a8);
  RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~RemotePromise((RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
                    *)&local_3a8);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~Request(&local_3e0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_3f8);
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults::Reader::
  getSturdyRef((ReaderFor<capnproto_test::capnp::test::TestSturdyRef> *)local_458,
               (Reader *)local_370);
  capnproto_test::capnp::test::TestSturdyRef::Reader::getObjectId(&local_428,(Reader *)local_458);
  local_408 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>(&local_428);
  bVar1 = kj::operator==("imported-foo",(StringPtr *)&local_408);
  if (!bVar1) {
    local_459 = kj::_::Debug::shouldLog(ERROR);
    while (local_459 != false) {
      Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults::Reader
      ::getSturdyRef(&local_4c0,(Reader *)local_370);
      capnproto_test::capnp::test::TestSturdyRef::Reader::getObjectId(&local_490,&local_4c0);
      AVar2 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>(&local_490);
      local_470 = AVar2;
      kj::_::Debug::log<char_const(&)[91],char_const(&)[13],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x46e,ERROR,
                 "\"failed: expected \" \"(\\\"imported-foo\\\") == (response.getSturdyRef().getObjectId().getAs<Text>())\", \"imported-foo\", response.getSturdyRef().getObjectId().getAs<Text>()"
                 ,(char (*) [91])
                  "failed: expected (\"imported-foo\") == (response.getSturdyRef().getObjectId().getAs<Text>())"
                 ,(char (*) [13])"imported-foo",(Reader *)&local_470);
      local_459 = false;
    }
  }
  Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~Response((Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
               *)local_370);
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::~Client
            ((Client *)local_2f0);
  TestContext::~TestContext((TestContext *)local_2b0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&hostId._builder.dataSize);
  Persistent<capnp::Text,_capnp::AnyPointer>::Client::~Client((Client *)local_60);
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::Client::~Client((Client *)local_28);
  return;
}

Assistant:

TEST(Rpc, RealmGatewayImport) {
  TestRealmGateway::Client gateway = kj::heap<TestGateway>();
  Persistent<Text>::Client bootstrap = kj::heap<TestPersistentText>("foo");

  MallocMessageBuilder hostIdBuilder;
  auto hostId = hostIdBuilder.getRoot<test::TestSturdyRefHostId>();
  hostId.setHost("server");

  TestContext context(bootstrap, gateway);
  auto client = context.rpcClient.bootstrap(hostId).castAs<Persistent<test::TestSturdyRef>>();

  auto response = client.saveRequest().send().wait(context.waitScope);

  EXPECT_EQ("imported-foo", response.getSturdyRef().getObjectId().getAs<Text>());
}